

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

bool __thiscall iDynTree::Model::isJointNameUsed(Model *this,string *jointName)

{
  size_t __n;
  int iVar1;
  long lVar2;
  ulong uVar3;
  size_type *psVar4;
  ulong uVar5;
  bool bVar6;
  
  lVar2 = (long)(this->joints).
                super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->joints).
                super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  bVar6 = lVar2 != 0;
  if (bVar6) {
    uVar3 = lVar2 >> 3;
    __n = jointName->_M_string_length;
    psVar4 = &((this->jointNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    uVar5 = 1;
    do {
      if (__n == *psVar4) {
        if (__n == 0) {
          return bVar6;
        }
        iVar1 = bcmp((jointName->_M_dataplus)._M_p,
                     (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar4 + -1))->_M_dataplus)._M_p,__n);
        if (iVar1 == 0) {
          return bVar6;
        }
      }
      bVar6 = uVar5 < uVar3;
      lVar2 = uVar5 + (-(ulong)(uVar3 == 0) - uVar3);
      uVar5 = uVar5 + 1;
      psVar4 = psVar4 + 4;
    } while (lVar2 != 0);
  }
  return bVar6;
}

Assistant:

bool Model::isJointNameUsed(const std::string jointName) const
{
    for(size_t i=0; i < this->getNrOfJoints(); i++ )
    {
        if( jointName == jointNames[i] )
        {
            return true;
        }
    }

    return false;
}